

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O0

undefined8 LatencyDumpDefaultImpl::usToString_abi_cxx11_(uint64_t us)

{
  _Setprecision _Var1;
  ostream *poVar2;
  ulong in_RSI;
  undefined8 in_RDI;
  undefined4 uVar3;
  undefined4 uVar7;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double tmp_2;
  double tmp_1;
  double tmp;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [376];
  ulong local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  if (local_10 < 1000) {
    poVar2 = (ostream *)std::ostream::operator<<(local_188,std::fixed);
    _Var1 = std::setprecision(0);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
    std::operator<<(poVar2," us");
  }
  else {
    uVar3 = (undefined4)local_10;
    uVar7 = (undefined4)(local_10 >> 0x20);
    if (local_10 < 1000000) {
      auVar4._8_4_ = uVar7;
      auVar4._0_8_ = local_10;
      auVar4._12_4_ = 0x45300000;
      poVar2 = (ostream *)std::ostream::operator<<(local_188,std::fixed);
      _Var1 = std::setprecision(1);
      poVar2 = std::operator<<(poVar2,_Var1);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,((auVar4._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0)) / 1000.0
                         );
      std::operator<<(poVar2," ms");
    }
    else if (local_10 < 600000000) {
      auVar5._8_4_ = uVar7;
      auVar5._0_8_ = local_10;
      auVar5._12_4_ = 0x45300000;
      poVar2 = (ostream *)std::ostream::operator<<(local_188,std::fixed);
      _Var1 = std::setprecision(1);
      poVar2 = std::operator<<(poVar2,_Var1);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,((auVar5._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0)) /
                                 1000000.0);
      std::operator<<(poVar2," s");
    }
    else {
      auVar6._8_4_ = uVar7;
      auVar6._0_8_ = local_10;
      auVar6._12_4_ = 0x45300000;
      poVar2 = (ostream *)std::ostream::operator<<(local_188,std::fixed);
      _Var1 = std::setprecision(0);
      poVar2 = std::operator<<(poVar2,_Var1);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,(((auVar6._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0)) / 60.0)
                                 / 1000000.0);
      std::operator<<(poVar2," m");
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

static std::string usToString(uint64_t us) {
        std::stringstream ss;
        if (us < 1000) {
            // us
            ss << std::fixed << std::setprecision(0) << us << " us";
        } else if (us < 1000000) {
            // ms
            double tmp = static_cast<double>(us / 1000.0);
            ss << std::fixed << std::setprecision(1) << tmp << " ms";
        } else if (us < (uint64_t)600 * 1000000) {
            // second (from 1 second to 10 mins)
            double tmp = static_cast<double>(us / 1000000.0);
            ss << std::fixed << std::setprecision(1) << tmp << " s";
        } else {
            // minute
            double tmp = static_cast<double>(us / 60.0 / 1000000.0);
            ss << std::fixed << std::setprecision(0) << tmp << " m";
        }
        return ss.str();
    }